

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

void mtbdd_fprintdot_nc(FILE *out,MTBDD mtbdd)

{
  MTBDD mtbdd_local;
  FILE *out_local;
  
  fprintf((FILE *)out,"digraph \"DD\" {\n");
  fprintf((FILE *)out,"graph [dpi = 300];\n");
  fprintf((FILE *)out,"center = true;\n");
  fprintf((FILE *)out,"edge [dir = forward];\n");
  fprintf((FILE *)out,"root [style=invis];\n");
  fprintf((FILE *)out,"root -> %lu [style=solid];\n",mtbdd);
  mtbdd_fprintdot_nc_rec(out,mtbdd);
  mtbdd_unmark_rec(mtbdd);
  fprintf((FILE *)out,"}\n");
  return;
}

Assistant:

void
mtbdd_fprintdot_nc(FILE *out, MTBDD mtbdd)
{
    fprintf(out, "digraph \"DD\" {\n");
    fprintf(out, "graph [dpi = 300];\n");
    fprintf(out, "center = true;\n");
    fprintf(out, "edge [dir = forward];\n");
    fprintf(out, "root [style=invis];\n");
    fprintf(out, "root -> %" PRIu64 " [style=solid];\n", mtbdd);

    mtbdd_fprintdot_nc_rec(out, mtbdd);
    mtbdd_unmark_rec(mtbdd);

    fprintf(out, "}\n");
}